

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  float *pfVar1;
  ImGuiWindow **ppIVar2;
  ImVec2 *pIVar3;
  int *piVar4;
  ImGuiNextWindowData *pIVar5;
  ImS8 *pIVar6;
  ImU16 *pIVar7;
  char cVar8;
  ImGuiNavLayer IVar9;
  ImGuiID IVar10;
  ImGuiContextHook *pIVar11;
  ImFontAtlas *pIVar12;
  uint *puVar13;
  ImGuiViewportP *pIVar14;
  ImGuiInputEvent *pIVar15;
  ImGuiTableTempData *pIVar16;
  ImGuiWindowStackData *pIVar17;
  ImGuiPopupData *pIVar18;
  ImGuiGroupData *pIVar19;
  ImGuiStackLevelInfo *pIVar20;
  undefined1 auVar21 [12];
  undefined8 uVar22;
  ImGuiContext *pIVar23;
  ImGuiContext *pIVar24;
  undefined3 uVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ImU16 IVar29;
  uint uVar30;
  ImGuiID IVar31;
  ImGuiInputSource IVar32;
  ImGuiNavLayer layer;
  ImGuiDir IVar33;
  ImGuiContext *ctx;
  uint *__dest;
  ImGuiInputEvent *__dest_00;
  ImGuiWindow *pIVar34;
  ImGuiWindowStackData *__dest_01;
  ImGuiPopupData *__dest_02;
  int *piVar35;
  int *piVar36;
  ImGuiGroupData *__dest_03;
  ImGuiStackLevelInfo *__dest_04;
  int i;
  int iVar37;
  ImGuiID IVar38;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *window_00;
  char *pcVar39;
  ImGuiNavMoveFlags move_flags;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar40;
  ImGuiContext *g;
  int iVar41;
  bool *pbVar42;
  ImGuiID IVar43;
  float *pfVar44;
  ImFont *font;
  float *pfVar45;
  ImGuiContext *g_8;
  ImRect *pIVar46;
  ImGuiContext *pIVar47;
  ImGuiWindow *old_nav_window;
  uint uVar48;
  ImGuiWindow *window;
  ulong uVar49;
  long lVar50;
  ImGuiContext *g_1;
  long lVar51;
  ImGuiContext *pIVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  byte bVar56;
  uint uVar57;
  float fVar58;
  ImVec2 IVar59;
  ImVec2 IVar60;
  ImVec2 IVar61;
  ImVec2 IVar62;
  ImVec2 IVar63;
  ImVec2 IVar64;
  ImVec4 IVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar81;
  float fVar70;
  float fVar71;
  ImVec2 IVar72;
  ImVec2 IVar73;
  int iVar82;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar80;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float local_88;
  float local_78;
  ImRect local_48;
  undefined1 auVar74 [16];
  
  pIVar23 = GImGui;
  bVar56 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x107e,"void ImGui::NewFrame()");
  }
  uVar30 = (GImGui->Hooks).Size;
  uVar49 = (ulong)(int)uVar30;
  if (0 < (long)uVar49) {
    lVar51 = -uVar49;
    lVar50 = uVar49 << 5;
    do {
      if ((long)(int)uVar30 < (long)uVar49) {
        pcVar39 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_0014251c;
      }
      pIVar11 = (pIVar23->Hooks).Data;
      if (*(int *)(pIVar11 + lVar50 + -0x1c) == 7) {
        memmove(pIVar11 + lVar50 + -0x20,pIVar11 + lVar50,((ulong)uVar30 + lVar51) * 0x20);
        uVar30 = (pIVar23->Hooks).Size - 1;
        (pIVar23->Hooks).Size = uVar30;
      }
      lVar51 = lVar51 + 1;
      bVar55 = 1 < uVar49;
      uVar49 = uVar49 - 1;
      lVar50 = lVar50 + -0x20;
    } while (bVar55);
    if (0 < (int)uVar30) {
      lVar50 = 0;
      lVar51 = 0;
      do {
        pIVar11 = (pIVar23->Hooks).Data;
        if (*(int *)(pIVar11 + lVar50 + 4) == 0) {
          (**(code **)(pIVar11 + lVar50 + 0x10))(pIVar23,pIVar11 + lVar50);
          uVar30 = (pIVar23->Hooks).Size;
        }
        lVar51 = lVar51 + 1;
        lVar50 = lVar50 + 0x20;
      } while (lVar51 < (int)uVar30);
    }
  }
  pIVar52 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f01,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar41 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar41 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x1f02,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar41 != 0) && (GImGui->FrameCountEnded != iVar41)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f03,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f04,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar12 = (GImGui->IO).Fonts;
  if (((pIVar12->Fonts).Size < 1) || ((pIVar12->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f05,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f06,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f07,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar58 = (GImGui->Style).Alpha;
  if ((fVar58 < 0.0) || (1.0 < fVar58)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f08,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f09,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f0a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar50 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar50 + 0x200] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..511, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x1f0d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 0x85);
  if (((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).BackendUsingLegacyKeyArrays == '\x01')
      ) && ((GImGui->IO).KeyMap[0x20c] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x1f11,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar52->SettingsLoaded == false) {
    if ((pIVar52->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2ce4,"void ImGui::UpdateSettings()");
    }
    pcVar39 = (pIVar52->IO).IniFilename;
    if (pcVar39 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar39);
    }
    pIVar52->SettingsLoaded = true;
  }
  if ((0.0 < pIVar52->SettingsDirtyTimer) &&
     (fVar58 = pIVar52->SettingsDirtyTimer - (pIVar52->IO).DeltaTime,
     pIVar52->SettingsDirtyTimer = fVar58, fVar58 <= 0.0)) {
    pcVar39 = (pIVar52->IO).IniFilename;
    if (pcVar39 == (char *)0x0) {
      (pIVar52->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar39);
    }
    pIVar52->SettingsDirtyTimer = 0.0;
  }
  fVar58 = (pIVar23->IO).DeltaTime;
  pIVar23->Time = (double)fVar58 + pIVar23->Time;
  pIVar23->WithinFrameScope = true;
  pIVar23->FrameCount = pIVar23->FrameCount + 1;
  pIVar23->TooltipOverrideCount = 0;
  pIVar23->WindowsActiveCount = 0;
  if ((pIVar23->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar36 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar36 = *piVar36 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar13 = (pIVar23->MenusIdSubmittedThisFrame).Data;
    if (puVar13 != (uint *)0x0) {
      memcpy(__dest,puVar13,(long)(pIVar23->MenusIdSubmittedThisFrame).Size << 2);
      puVar13 = (pIVar23->MenusIdSubmittedThisFrame).Data;
      if ((puVar13 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar36 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar36 = *piVar36 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar13,GImAllocatorUserData);
    }
    (pIVar23->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar23->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar58 = (pIVar23->IO).DeltaTime;
  }
  pIVar52 = GImGui;
  (pIVar23->MenusIdSubmittedThisFrame).Size = 0;
  iVar41 = pIVar23->FramerateSecPerFrameIdx;
  pIVar23->FramerateSecPerFrameAccum =
       (fVar58 - pIVar23->FramerateSecPerFrame[iVar41]) + pIVar23->FramerateSecPerFrameAccum;
  pIVar23->FramerateSecPerFrame[iVar41] = fVar58;
  iVar37 = iVar41 + (int)((ulong)((long)(iVar41 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar23->FramerateSecPerFrameIdx = iVar41 + 1 + ((iVar37 >> 6) - (iVar37 >> 0x1f)) * -0x78;
  iVar41 = 0x77;
  if (pIVar23->FramerateSecPerFrameCount < 0x77) {
    iVar41 = pIVar23->FramerateSecPerFrameCount;
  }
  pIVar23->FramerateSecPerFrameCount = iVar41 + 1;
  uVar30 = -(uint)(0.0 < pIVar23->FramerateSecPerFrameAccum);
  (pIVar23->IO).Framerate =
       (float)(~uVar30 & 0x7f7fffff |
              (uint)(1.0 / (pIVar23->FramerateSecPerFrameAccum / (float)(iVar41 + 1))) & uVar30);
  if ((pIVar52->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x2e14,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar14 = *(pIVar52->Viewports).Data;
  (pIVar14->super_ImGuiViewport).Flags = 5;
  (pIVar14->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar14->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar14->super_ImGuiViewport).Size = (pIVar52->IO).DisplaySize;
  if (0 < (pIVar52->Viewports).Size) {
    lVar50 = 0;
    do {
      pIVar14 = (pIVar52->Viewports).Data[lVar50];
      IVar59 = pIVar14->BuildWorkOffsetMin;
      pIVar14->WorkOffsetMin = IVar59;
      IVar72 = pIVar14->BuildWorkOffsetMax;
      pIVar14->WorkOffsetMax = IVar72;
      (pIVar14->BuildWorkOffsetMin).x = 0.0;
      (pIVar14->BuildWorkOffsetMin).y = 0.0;
      (pIVar14->BuildWorkOffsetMax).x = 0.0;
      (pIVar14->BuildWorkOffsetMax).y = 0.0;
      IVar61 = (pIVar14->super_ImGuiViewport).Size;
      fVar58 = IVar72.x + (IVar61.x - IVar59.x);
      fVar80 = IVar72.y + (IVar61.y - IVar59.y);
      IVar61 = (pIVar14->super_ImGuiViewport).Pos;
      IVar72.x = IVar61.x + IVar59.x;
      IVar72.y = IVar61.y + IVar59.y;
      IVar61.x = (float)(-(uint)(0.0 < fVar58) & (uint)fVar58);
      IVar61.y = (float)(-(uint)(0.0 < fVar80) & (uint)fVar80);
      (pIVar14->super_ImGuiViewport).WorkPos = IVar72;
      (pIVar14->super_ImGuiViewport).WorkSize = IVar61;
      lVar50 = lVar50 + 1;
    } while (lVar50 < (pIVar52->Viewports).Size);
  }
  ((pIVar23->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar12 = (GImGui->IO).Fonts;
    if ((pIVar12->Fonts).Size < 1) {
      pcVar39 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_0014251c:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                    ,0x702,pcVar39);
    }
    font = *(pIVar12->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar23->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x10a2,"void ImGui::NewFrame()");
  }
  lVar50 = (long)(pIVar23->Viewports).Size;
  IVar65 = _DAT_0019ac00;
  if (0 < lVar50) {
    lVar51 = 0;
    do {
      pIVar14 = (pIVar23->Viewports).Data[lVar51];
      fVar58 = (pIVar14->super_ImGuiViewport).Pos.x;
      if (fVar58 < IVar65.x) {
        IVar65.x = fVar58;
      }
      fVar80 = (pIVar14->super_ImGuiViewport).Pos.y;
      if (fVar80 < IVar65.y) {
        IVar65.y = fVar80;
      }
      fVar58 = fVar58 + (pIVar14->super_ImGuiViewport).Size.x;
      if (IVar65.z < fVar58) {
        IVar65.z = fVar58;
      }
      fVar80 = fVar80 + (pIVar14->super_ImGuiViewport).Size.y;
      if (IVar65.w < fVar80) {
        IVar65.w = fVar80;
      }
      lVar51 = lVar51 + 1;
    } while (lVar50 != lVar51);
  }
  (pIVar23->DrawListSharedData).ClipRectFullscreen = IVar65;
  fVar58 = (pIVar23->Style).CircleTessellationMaxError;
  (pIVar23->DrawListSharedData).CurveTessellationTol = (pIVar23->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar23->DrawListSharedData,fVar58);
  bVar55 = (pIVar23->Style).AntiAliasedLines;
  uVar30 = (uint)bVar55;
  (pIVar23->DrawListSharedData).InitialFlags = (uint)bVar55;
  if (((pIVar23->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar23->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar30 = bVar55 | 2;
    (pIVar23->DrawListSharedData).InitialFlags = uVar30;
  }
  if ((pIVar23->Style).AntiAliasedFill == true) {
    uVar30 = uVar30 | 4;
    (pIVar23->DrawListSharedData).InitialFlags = uVar30;
  }
  if (((pIVar23->IO).BackendFlags & 8) != 0) {
    (pIVar23->DrawListSharedData).InitialFlags = uVar30 | 8;
  }
  if (0 < (pIVar23->Viewports).Size) {
    lVar50 = 0;
    do {
      pIVar14 = (pIVar23->Viewports).Data[lVar50];
      (pIVar14->DrawDataP).DisplaySize.x = 0.0;
      (pIVar14->DrawDataP).DisplaySize.y = 0.0;
      (pIVar14->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar14->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar14->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar14->DrawDataP).DisplayPos.x = 0.0;
      (pIVar14->DrawDataP).DisplayPos.y = 0.0;
      (pIVar14->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar14->DrawDataP).field_0x1 = 0;
      (pIVar14->DrawDataP).CmdListsCount = 0;
      (pIVar14->DrawDataP).TotalIdxCount = 0;
      (pIVar14->DrawDataP).TotalVtxCount = 0;
      lVar50 = lVar50 + 1;
    } while (lVar50 < (pIVar23->Viewports).Size);
  }
  pIVar52 = GImGui;
  if ((pIVar23->DragDropActive != false) &&
     (IVar38 = (pIVar23->DragDropPayload).SourceId, IVar38 == pIVar23->ActiveId)) {
    if (GImGui->ActiveId == IVar38) {
      GImGui->ActiveIdIsAlive = IVar38;
    }
    if (pIVar52->ActiveIdPreviousFrame == IVar38) {
      pIVar52->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar23->HoveredIdPreviousFrame == 0) {
    IVar38 = pIVar23->HoveredId;
    pIVar23->HoveredIdTimer = 0.0;
    pIVar23->HoveredIdNotActiveTimer = 0.0;
    if (IVar38 == 0) goto LAB_0013f62a;
LAB_0013f603:
    fVar58 = (pIVar23->IO).DeltaTime;
    pIVar23->HoveredIdTimer = pIVar23->HoveredIdTimer + fVar58;
    IVar31 = IVar38;
    if (pIVar23->ActiveId != IVar38) {
      pIVar23->HoveredIdNotActiveTimer = fVar58 + pIVar23->HoveredIdNotActiveTimer;
      IVar31 = pIVar23->ActiveId;
    }
  }
  else {
    IVar38 = pIVar23->HoveredId;
    if (IVar38 != 0) {
      if (pIVar23->ActiveId == IVar38) {
        pIVar23->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0013f603;
    }
LAB_0013f62a:
    IVar38 = 0;
    IVar31 = pIVar23->ActiveId;
  }
  pIVar23->HoveredIdPreviousFrame = IVar38;
  pIVar23->HoveredIdPreviousFrameUsingMouseWheel = pIVar23->HoveredIdUsingMouseWheel;
  pIVar23->HoveredId = 0;
  pIVar23->HoveredIdAllowOverlap = false;
  pIVar23->HoveredIdUsingMouseWheel = false;
  pIVar23->HoveredIdDisabled = false;
  if (((pIVar23->ActiveIdIsAlive != IVar31) && (IVar31 != 0)) &&
     (pIVar23->ActiveIdPreviousFrame == IVar31)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar31 = pIVar23->ActiveId;
  }
  fVar58 = (pIVar23->IO).DeltaTime;
  if (IVar31 != 0) {
    pIVar23->ActiveIdTimer = pIVar23->ActiveIdTimer + fVar58;
  }
  pIVar23->LastActiveIdTimer = fVar58 + pIVar23->LastActiveIdTimer;
  pIVar23->ActiveIdPreviousFrame = IVar31;
  pIVar23->ActiveIdPreviousFrameWindow = pIVar23->ActiveIdWindow;
  pIVar23->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar23->ActiveIdHasBeenEditedBefore;
  pIVar23->ActiveIdIsAlive = 0;
  pIVar23->ActiveIdHasBeenEditedThisFrame = false;
  pIVar23->ActiveIdPreviousFrameIsAlive = false;
  pIVar23->ActiveIdIsJustActivated = false;
  if (pIVar23->TempInputId == 0) {
LAB_0013f716:
    if (IVar31 == 0) {
      (pIVar23->ActiveIdUsingKeyInputMask).Storage[1] = 0;
      (pIVar23->ActiveIdUsingKeyInputMask).Storage[2] = 0;
      (pIVar23->ActiveIdUsingKeyInputMask).Storage[3] = 0;
      (pIVar23->ActiveIdUsingKeyInputMask).Storage[4] = 0;
      pIVar23->ActiveIdUsingNavDirMask = 0;
      pIVar23->ActiveIdUsingNavInputMask = 0;
      (pIVar23->ActiveIdUsingKeyInputMask).Storage[0] = 0;
      (pIVar23->ActiveIdUsingKeyInputMask).Storage[1] = 0;
    }
  }
  else if (IVar31 != pIVar23->TempInputId) {
    pIVar23->TempInputId = 0;
    goto LAB_0013f716;
  }
  pIVar23->DragDropAcceptIdPrev = pIVar23->DragDropAcceptIdCurr;
  pIVar23->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar23->DragDropAcceptIdCurr = 0;
  pIVar23->DragDropWithinSource = false;
  pIVar23->DragDropWithinTarget = false;
  pIVar23->DragDropHoldJustPressedId = 0;
  if ((pIVar23->InputEventsTrail).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar36 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar36 = *piVar36 + 1;
    }
    __dest_00 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar15 = (pIVar23->InputEventsTrail).Data;
    if (pIVar15 != (ImGuiInputEvent *)0x0) {
      memcpy(__dest_00,pIVar15,(long)(pIVar23->InputEventsTrail).Size * 0x18);
      pIVar15 = (pIVar23->InputEventsTrail).Data;
      if ((pIVar15 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar36 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar36 = *piVar36 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
    }
    (pIVar23->InputEventsTrail).Data = __dest_00;
    (pIVar23->InputEventsTrail).Capacity = 0;
  }
  (pIVar23->InputEventsTrail).Size = 0;
  UpdateInputEvents((pIVar23->IO).ConfigInputTrickleEventQueue);
  pIVar52 = GImGui;
  bVar55 = (GImGui->IO).KeyCtrl;
  bVar26 = (GImGui->IO).KeyShift;
  bVar27 = (GImGui->IO).KeyAlt;
  uVar30 = bVar55 + 2;
  if (bVar26 == false) {
    uVar30 = (uint)bVar55;
  }
  uVar48 = uVar30 + 4;
  if (bVar27 == false) {
    uVar48 = uVar30;
  }
  bVar28 = (GImGui->IO).KeySuper;
  uVar30 = uVar48 + 8;
  if (bVar28 == false) {
    uVar30 = uVar48;
  }
  (GImGui->IO).KeyMods = uVar30;
  cVar8 = (pIVar52->IO).BackendUsingLegacyKeyArrays;
  if (cVar8 == '\0') {
    lVar50 = 0;
    do {
      if ((pIVar52->IO).KeysDown[lVar50] != false) {
        __assert_fail("io.KeysDown[n] == false && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                      ,0xf54,"void ImGui::UpdateKeyboardInputs()");
      }
      lVar50 = lVar50 + 1;
    } while (lVar50 != 0x200);
  }
  else {
    if (pIVar52->FrameCount == 0) {
      lVar50 = 0;
      do {
        if ((pIVar52->IO).KeyMap[lVar50] != -1) {
          __assert_fail("g.IO.KeyMap[n] == -1 && \"Backend is not allowed to write to io.KeyMap[0..511]!\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0xf5a,"void ImGui::UpdateKeyboardInputs()");
        }
        lVar50 = lVar50 + 1;
      } while (lVar50 != 0x200);
    }
    lVar50 = 0;
    do {
      uVar30 = (pIVar52->IO).KeyMap[lVar50 + 0x200];
      if ((ulong)uVar30 != 0xffffffff) {
        if (0x1ff < uVar30) {
          __assert_fail("IsLegacyKey((ImGuiKey)io.KeyMap[n])",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                        ,0xf60,"void ImGui::UpdateKeyboardInputs()");
        }
        (pIVar52->IO).KeyMap[uVar30] = (int)lVar50 + 0x200;
      }
      lVar50 = lVar50 + 1;
    } while (lVar50 != 0x85);
    bVar53 = cVar8 == '\x01';
    lVar50 = 0;
    do {
      while (bVar54 = (pIVar52->IO).KeysDown[lVar50], !bVar53 && (bVar54 & 1U) == 0) {
        lVar50 = lVar50 + 1;
        if (lVar50 == 0x200) goto LAB_0013f980;
      }
      iVar41 = (pIVar52->IO).KeyMap[lVar50];
      if (0x84 < iVar41 - 0x200U && iVar41 != -1) {
        __assert_fail("io.KeyMap[n] == -1 || IsNamedKey(key)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                      ,0xf69,"void ImGui::UpdateKeyboardInputs()");
      }
      iVar37 = (int)lVar50;
      if (iVar41 != -1) {
        iVar37 = iVar41;
      }
      (pIVar52->IO).KeysData[iVar37].Down = bVar54;
      (pIVar52->IO).BackendUsingLegacyKeyArrays = '\x01';
      bVar53 = true;
      bVar54 = lVar50 != 0x1ff;
      lVar50 = lVar50 + 1;
    } while (bVar54);
    (pIVar52->IO).KeysData[0x281].Down = bVar55;
    (pIVar52->IO).KeysData[0x282].Down = bVar26;
    (pIVar52->IO).KeysData[0x283].Down = bVar27;
    (pIVar52->IO).KeysData[0x284].Down = bVar28;
  }
LAB_0013f980:
  uVar30 = (pIVar52->IO).BackendFlags;
  if ((uVar30 & 1) == 0) {
    lVar50 = 0;
    do {
      (&(pIVar52->IO).KeysData[0x269].Down)[lVar50] = false;
      *(undefined4 *)((long)&(pIVar52->IO).KeysData[0x269].AnalogValue + lVar50) = 0;
      lVar50 = lVar50 + 0x10;
    } while (lVar50 != 0x180);
  }
  lVar50 = 0xd88;
  do {
    fVar58 = *(float *)((long)pIVar52 + lVar50 + -4);
    *(float *)(&pIVar52->Initialized + lVar50) = fVar58;
    fVar80 = -1.0;
    if ((*(char *)((long)pIVar52 + lVar50 + -8) == '\x01') && (fVar80 = 0.0, 0.0 <= fVar58)) {
      fVar80 = fVar58 + (pIVar52->IO).DeltaTime;
    }
    *(float *)((long)pIVar52 + lVar50 + -4) = fVar80;
    lVar50 = lVar50 + 0x10;
  } while (lVar50 != 0x35d8);
  (pIVar52->IO).WantSetMousePos = false;
  uVar48 = (pIVar52->IO).ConfigFlags;
  uVar30 = uVar30 & (uVar48 & 2) >> 1;
  if ((uVar30 == 1) && ((pIVar52->IO).BackendUsingLegacyNavInputArray == false)) {
    lVar50 = 0;
    do {
      fVar58 = (pIVar52->IO).NavInputs[lVar50];
      if ((fVar58 != 0.0) || (NAN(fVar58))) {
        __assert_fail("io.NavInputs[n] == 0.0f && \"Backend needs to either only use io.AddKeyEvent()/io.AddKeyAnalogEvent(), either only fill legacy io.NavInputs[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                      ,0x273c,"void ImGui::NavUpdate()");
      }
      lVar50 = lVar50 + 1;
    } while (lVar50 != 0x14);
    fVar58 = (pIVar52->IO).KeysData[0x26c].AnalogValue;
    (pIVar52->IO).NavInputs[0] = fVar58;
    if (0.0 < fVar58) {
      pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar58 = (pIVar52->IO).KeysData[0x26e].AnalogValue;
    (pIVar52->IO).NavInputs[1] = fVar58;
    if (0.0 < fVar58) {
      pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar58 = (pIVar52->IO).KeysData[0x26d].AnalogValue;
    (pIVar52->IO).NavInputs[3] = fVar58;
    if (0.0 < fVar58) {
      pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar58 = (pIVar52->IO).KeysData[0x26b].AnalogValue;
    (pIVar52->IO).NavInputs[2] = fVar58;
    if (0.0 < fVar58) {
      pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar58 = (pIVar52->IO).KeysData[0x271].AnalogValue;
    (pIVar52->IO).NavInputs[4] = fVar58;
    if (0.0 < fVar58) {
      pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar58 = (pIVar52->IO).KeysData[0x272].AnalogValue;
    (pIVar52->IO).NavInputs[5] = fVar58;
    if (0.0 < fVar58) {
      pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar58 = (pIVar52->IO).KeysData[0x26f].AnalogValue;
    (pIVar52->IO).NavInputs[6] = fVar58;
    if (0.0 < fVar58) {
      pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar58 = (pIVar52->IO).KeysData[0x270].AnalogValue;
    (pIVar52->IO).NavInputs[7] = fVar58;
    if (0.0 < fVar58) {
      pIVar52->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar58 = (pIVar52->IO).KeysData[0x273].AnalogValue;
    fVar80 = (pIVar52->IO).KeysData[0x274].AnalogValue;
    (pIVar52->IO).NavInputs[0xc] = fVar58;
    (pIVar52->IO).NavInputs[0xd] = fVar80;
    (pIVar52->IO).NavInputs[0xe] = fVar58;
    (pIVar52->IO).NavInputs[0xf] = fVar80;
    (pIVar52->IO).NavInputs[8] = (pIVar52->IO).KeysData[0x27b].AnalogValue;
    (pIVar52->IO).NavInputs[9] = (pIVar52->IO).KeysData[0x27c].AnalogValue;
    (pIVar52->IO).NavInputs[10] = (pIVar52->IO).KeysData[0x279].AnalogValue;
    (pIVar52->IO).NavInputs[0xb] = (pIVar52->IO).KeysData[0x27a].AnalogValue;
  }
  if ((uVar48 & 1) != 0) {
    if ((pIVar52->IO).KeysData[0x20c].Down == true) {
      (pIVar52->IO).NavInputs[0] = 1.0;
      pIVar52->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar52->IO).KeysData[0x20d].Down == true) {
      (pIVar52->IO).NavInputs[2] = 1.0;
      pIVar52->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar52->IO).KeysData[0x20e].Down == true) {
      (pIVar52->IO).NavInputs[1] = 1.0;
      pIVar52->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar52->IO).KeysData[0x201].Down == true) {
      (pIVar52->IO).NavInputs[0x10] = 1.0;
      pIVar52->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar52->IO).KeysData[0x202].Down == true) {
      (pIVar52->IO).NavInputs[0x11] = 1.0;
      pIVar52->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar52->IO).KeysData[0x203].Down == true) {
      (pIVar52->IO).NavInputs[0x12] = 1.0;
      pIVar52->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar52->IO).KeysData[0x204].Down == true) {
      (pIVar52->IO).NavInputs[0x13] = 1.0;
      pIVar52->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if (bVar55 != false) {
      (pIVar52->IO).NavInputs[0xe] = 1.0;
    }
    if (bVar26 != false) {
      (pIVar52->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar1 = (pIVar52->IO).NavInputsDownDuration;
  pfVar44 = pfVar1;
  pfVar45 = (pIVar52->IO).NavInputsDownDurationPrev;
  for (lVar50 = 0x14; lVar50 != 0; lVar50 = lVar50 + -1) {
    *pfVar45 = *pfVar44;
    pfVar44 = pfVar44 + (ulong)bVar56 * -2 + 1;
    pfVar45 = pfVar45 + (ulong)bVar56 * -2 + 1;
  }
  lVar50 = 0;
  do {
    fVar58 = -1.0;
    if (0.0 < (pIVar52->IO).NavInputs[lVar50]) {
      fVar58 = 0.0;
      if (0.0 <= pfVar1[lVar50]) {
        fVar58 = pfVar1[lVar50] + (pIVar52->IO).DeltaTime;
      }
    }
    pfVar1[lVar50] = fVar58;
    lVar50 = lVar50 + 1;
  } while (lVar50 != 0x14);
  if (pIVar52->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar52->NavInitRequest = false;
  pIVar52->NavInitRequestFromMove = false;
  pIVar52->NavInitResultId = 0;
  pIVar52->NavJustMovedToId = 0;
  if (pIVar52->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar52->NavTabbingCounter = 0;
  pIVar52->NavMoveSubmitted = false;
  pIVar52->NavMoveScoringItems = false;
  if ((((pIVar52->NavMousePosDirty == true) && (pIVar52->NavIdIsAlive == true)) &&
      (pIVar52->NavDisableHighlight == false)) && (pIVar52->NavDisableMouseHover == true)) {
    bVar55 = pIVar52->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar55 = false;
  }
  pIVar52->NavMousePosDirty = false;
  IVar9 = pIVar52->NavLayer;
  if (ImGuiNavLayer_Menu < IVar9) {
    __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x277b,"void ImGui::NavUpdate()");
  }
  pIVar34 = pIVar52->NavWindow;
  pIVar40 = pIVar34;
  if (pIVar34 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar40->RootWindow == pIVar40) || ((pIVar40->Flags & 0x14000000) != 0)) {
        if (pIVar40 != pIVar34) {
          pIVar40->NavLastChildNavWindow = pIVar34;
        }
        break;
      }
      ppIVar2 = &pIVar40->ParentWindow;
      pIVar40 = *ppIVar2;
    } while (*ppIVar2 != (ImGuiWindow *)0x0);
    if ((IVar9 == ImGuiNavLayer_Main) && (pIVar34->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar34->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar47 = GImGui;
  pIVar34 = GetTopMostPopupModal();
  if (pIVar34 != (ImGuiWindow *)0x0) {
    pIVar47->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar47->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar47->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar58 = (pIVar47->IO).DeltaTime * -10.0 + pIVar47->NavWindowingHighlightAlpha;
    fVar58 = (float)(-(uint)(0.0 <= fVar58) & (uint)fVar58);
    pIVar47->NavWindowingHighlightAlpha = fVar58;
    if ((pIVar47->DimBgRatio <= 0.0) && (fVar58 <= 0.0)) {
      pIVar47->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar34 == (ImGuiWindow *)0x0) && (pIVar47->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar26 = (bool)(-((pIVar47->IO).NavInputsDownDuration[3] == 0.0) & 1);
    if ((pIVar47->IO).KeyCtrl != true) goto LAB_0013fed6;
    bVar27 = IsKeyPressed(0x200,true);
  }
  else {
    bVar26 = false;
LAB_0013fed6:
    bVar27 = false;
  }
  if (((bVar26 | bVar27) == 1) &&
     ((pIVar34 = pIVar47->NavWindow, pIVar34 != (ImGuiWindow *)0x0 ||
      (pIVar34 = FindWindowNavFocusable((pIVar47->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar34 != (ImGuiWindow *)0x0)))) {
    pIVar34 = pIVar34->RootWindow;
    pIVar47->NavWindowingTargetAnim = pIVar34;
    pIVar47->NavWindowingTarget = pIVar34;
    pIVar47->NavWindowingTimer = 0.0;
    pIVar47->NavWindowingHighlightAlpha = 0.0;
    pIVar47->NavWindowingToggleLayer = bVar26;
    pIVar47->NavInputSource = bVar27 ^ ImGuiInputSource_Gamepad;
  }
  fVar58 = (pIVar47->IO).DeltaTime + pIVar47->NavWindowingTimer;
  pIVar47->NavWindowingTimer = fVar58;
  if (pIVar47->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_0014014f:
    bVar26 = false;
    pIVar34 = (ImGuiWindow *)0x0;
  }
  else {
    IVar32 = pIVar47->NavInputSource;
    if (IVar32 != ImGuiInputSource_Gamepad) {
LAB_001400c0:
      if (IVar32 == ImGuiInputSource_Keyboard) {
        fVar80 = (pIVar47->NavWindowingTimer + -0.2) / 0.05;
        fVar58 = 1.0;
        if (fVar80 <= 1.0) {
          fVar58 = fVar80;
        }
        fVar58 = (float)(~-(uint)(fVar80 < 0.0) & (uint)fVar58);
        uVar57 = -(uint)(fVar58 <= pIVar47->NavWindowingHighlightAlpha);
        pIVar47->NavWindowingHighlightAlpha =
             (float)(uVar57 & (uint)pIVar47->NavWindowingHighlightAlpha | ~uVar57 & (uint)fVar58);
        bVar26 = IsKeyPressed(0x200,true);
        if (bVar26) {
          NavUpdateWindowingHighlightWindow((pIVar47->IO).KeyShift - 1 | 1);
        }
        if ((pIVar47->IO).KeyCtrl == false) {
          pIVar34 = pIVar47->NavWindowingTarget;
          bVar26 = false;
          goto LAB_00140154;
        }
      }
      goto LAB_0014014f;
    }
    fVar80 = (fVar58 + -0.2) / 0.05;
    fVar58 = 1.0;
    if (fVar80 <= 1.0) {
      fVar58 = fVar80;
    }
    fVar58 = (float)(~-(uint)(fVar80 < 0.0) & (uint)fVar58);
    uVar57 = -(uint)(fVar58 <= pIVar47->NavWindowingHighlightAlpha);
    fVar77 = (float)(uVar57 & (uint)pIVar47->NavWindowingHighlightAlpha | ~uVar57 & (uint)fVar58);
    pIVar47->NavWindowingHighlightAlpha = fVar77;
    fVar58 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar80 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar41 = (uint)(0.0 < fVar58) - (uint)(0.0 < fVar80);
    if (iVar41 != 0) {
      NavUpdateWindowingHighlightWindow(iVar41);
      pIVar47->NavWindowingHighlightAlpha = 1.0;
      fVar77 = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar47->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0014014f;
      IVar32 = pIVar47->NavInputSource;
      goto LAB_001400c0;
    }
    pbVar42 = &pIVar47->NavWindowingToggleLayer;
    *pbVar42 = (bool)(*pbVar42 & fVar77 < 1.0);
    if (*pbVar42 == false) {
      pIVar34 = pIVar47->NavWindowingTarget;
      bVar26 = false;
    }
    else {
      bVar26 = pIVar47->NavWindow != (ImGuiWindow *)0x0;
      pIVar34 = (ImGuiWindow *)0x0;
    }
    pIVar47->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00140154:
  if (((((pIVar47->IO).ConfigFlags & 1) != 0) && ((pIVar47->IO).KeyMods == 4)) &&
     (((pIVar47->IO).KeyModsPrev & 4) == 0)) {
    pIVar47->NavWindowingToggleLayer = true;
    pIVar47->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar47->NavWindowingToggleLayer == true) &&
     (pIVar47->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar47->IO).InputQueueCharacters.Size) ||
        (((pIVar47->IO).KeyCtrl != false || ((pIVar47->IO).KeyShift != false)))) ||
       (bVar27 = true, (pIVar47->IO).KeySuper == true)) {
      pIVar47->NavWindowingToggleLayer = false;
      bVar27 = false;
    }
    if ((((((pIVar47->IO).KeyMods & 4) == 0) && (((pIVar47->IO).KeyModsPrev & 4) != 0)) && (bVar27))
       && ((pIVar47->ActiveId == 0 || (pIVar47->ActiveIdAllowOverlap == true)))) {
      bVar27 = IsMousePosValid(&(pIVar47->IO).MousePos);
      bVar28 = IsMousePosValid(&(pIVar47->IO).MousePosPrev);
      bVar26 = (bool)(bVar26 | bVar28 == bVar27);
    }
    if ((pIVar47->IO).KeyAlt == false) {
      pIVar47->NavWindowingToggleLayer = false;
    }
  }
  pIVar40 = pIVar47->NavWindowingTarget;
  if ((pIVar40 != (ImGuiWindow *)0x0) && ((pIVar40->Flags & 4) == 0)) {
    if (pIVar47->NavInputSource == ImGuiInputSource_Gamepad) {
      IVar59 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar59.x = 0.0;
      IVar59.y = 0.0;
      if ((pIVar47->NavInputSource == ImGuiInputSource_Keyboard) &&
         ((pIVar47->IO).KeyShift == false)) {
        IVar59.x = (float)(int)(GImGui->IO).KeysData[0x202].Down -
                   (float)(int)(GImGui->IO).KeysData[0x201].Down;
        IVar59.y = (float)(int)(GImGui->IO).KeysData[0x204].Down -
                   (float)(int)(GImGui->IO).KeysData[0x203].Down;
      }
    }
    fVar58 = IVar59.y;
    if (((IVar59.x != 0.0) || (fVar58 != 0.0)) || (NAN(fVar58))) {
      fVar80 = (pIVar47->IO).DisplayFramebufferScale.x;
      fVar77 = (pIVar47->IO).DisplayFramebufferScale.y;
      if (fVar77 <= fVar80) {
        fVar80 = fVar77;
      }
      fVar80 = (float)(int)(fVar80 * (pIVar47->IO).DeltaTime * 800.0);
      pIVar40 = pIVar40->RootWindow;
      local_48.Min.x = (pIVar40->Pos).x + IVar59.x * fVar80;
      local_48.Min.y = (pIVar40->Pos).y + fVar58 * fVar80;
      SetWindowPos(pIVar40,&local_48.Min,1);
      if (((pIVar40->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar47->NavDisableMouseHover = true;
    }
  }
  if (pIVar34 != (ImGuiWindow *)0x0) {
    if ((pIVar47->NavWindow == (ImGuiWindow *)0x0) || (pIVar34 != pIVar47->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar24 = GImGui;
      pIVar24->NavMousePosDirty = true;
      pIVar24->NavDisableHighlight = false;
      pIVar24->NavDisableMouseHover = true;
      pIVar40 = pIVar34->NavLastChildNavWindow;
      if ((pIVar40 == (ImGuiWindow *)0x0) || (pIVar40->WasActive == false)) {
        pIVar40 = pIVar34;
      }
      ClosePopupsOverWindow(pIVar40,false);
      FocusWindow(pIVar40);
      if (pIVar40->NavLastIds[0] == 0) {
        NavInitWindow(pIVar40,false);
      }
      if ((pIVar40->DC).NavLayersActiveMaskNext == 2) {
        pIVar47->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar47->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar26) && (pIVar47->NavWindow != (ImGuiWindow *)0x0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar34 = pIVar47->NavWindow;
    pIVar40 = pIVar34;
    do {
      window_00 = pIVar40;
      if ((window_00->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window_00->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar40 = window_00->ParentWindow;
    } while ((window_00->Flags & 0x15000000U) == 0x1000000);
    if (window_00 != pIVar34) {
      FocusWindow(window_00);
      window_00->NavLastChildNavWindow = pIVar34;
      pIVar34 = pIVar47->NavWindow;
    }
    IVar9 = pIVar47->NavLayer;
    if (((pIVar34->DC).NavLayersActiveMask & 2) == 0) {
      layer = ImGuiNavLayer_Main;
      if (IVar9 == ImGuiNavLayer_Main) goto LAB_0014054d;
    }
    else if (IVar9 == ImGuiNavLayer_Main) {
      pIVar34->NavLastIds[1] = 0;
      layer = ImGuiNavLayer_Menu;
    }
    else {
      layer = IVar9 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
    pIVar47 = GImGui;
    pIVar47->NavMousePosDirty = true;
    pIVar47->NavDisableHighlight = false;
    pIVar47->NavDisableMouseHover = true;
  }
LAB_0014054d:
  local_88._0_1_ = (char)uVar30;
  cVar8 = local_88._0_1_;
  if (((uVar48 & 1) == 0 && local_88._0_1_ == '\0') || (pIVar52->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar52->IO).NavActive = false;
LAB_00140598:
    bVar26 = pIVar52->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar26 = (pIVar52->NavWindow->Flags & 0x40000U) == 0;
    (pIVar52->IO).NavActive = bVar26;
    if (((!bVar26) || (pIVar52->NavId == 0)) ||
       (bVar26 = true, pIVar52->NavDisableHighlight != false)) goto LAB_00140598;
  }
  (pIVar52->IO).NavVisible = bVar26;
  pIVar47 = GImGui;
  fVar58 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar58 == 0.0) && (!NAN(fVar58))) {
    if (GImGui->ActiveId == 0) {
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        pIVar34 = GImGui->NavWindow;
        if (pIVar34 == (ImGuiWindow *)0x0) {
          uVar30 = (GImGui->OpenPopupStack).Size;
          if (0 < (int)uVar30) {
LAB_001409e2:
            if ((((GImGui->OpenPopupStack).Data[(ulong)uVar30 - 1].Window)->Flags & 0x8000000) == 0)
            {
              ClosePopupToLevel(uVar30 - 1,true);
            }
            goto LAB_0014060b;
          }
        }
        else {
          if (((pIVar34 != pIVar34->RootWindow) && ((pIVar34->Flags & 0x4000000) == 0)) &&
             (pIVar40 = pIVar34->ParentWindow, pIVar40 != (ImGuiWindow *)0x0)) {
            if (pIVar34->ChildId == 0) {
              __assert_fail("child_window->ChildId != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                            ,0x28fa,"void ImGui::NavUpdateCancelRequest()");
            }
            IVar61 = pIVar34->Size;
            fVar77 = (pIVar34->Pos).x;
            fVar70 = (pIVar34->Pos).y;
            FocusWindow(pIVar40);
            IVar59 = (pIVar40->DC).CursorStartPos;
            fVar58 = IVar59.x;
            local_48.Min.x = fVar77 - fVar58;
            fVar80 = IVar59.y;
            local_48.Min.y = fVar70 - fVar80;
            local_48.Max.x = (IVar61.x + fVar77) - fVar58;
            local_48.Max.y = (IVar61.y + fVar70) - fVar80;
            SetNavID(pIVar34->ChildId,ImGuiNavLayer_Main,0,&local_48);
            goto LAB_001405f4;
          }
          uVar30 = (GImGui->OpenPopupStack).Size;
          if (0 < (int)uVar30) goto LAB_001409e2;
          if ((pIVar34->Flags & 0x5000000U) != 0x1000000) {
            pIVar34->NavLastIds[0] = 0;
          }
        }
        pIVar47->NavId = 0;
        pIVar47->NavFocusScopeId = 0;
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
LAB_001405f4:
        pIVar47 = GImGui;
        pIVar47->NavMousePosDirty = true;
        pIVar47->NavDisableHighlight = false;
        pIVar47->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
LAB_0014060b:
  pIVar52->NavActivateId = 0;
  pIVar52->NavActivateDownId = 0;
  pIVar52->NavActivatePressedId = 0;
  pIVar52->NavActivateInputId = 0;
  pIVar52->NavActivateFlags = 0;
  IVar38 = pIVar52->NavId;
  IVar31 = 0;
  if (((IVar38 == 0) || (pIVar52->NavDisableHighlight != false)) ||
     (pIVar52->NavWindowingTarget != (ImGuiWindow *)0x0)) {
    IVar43 = 0;
    IVar31 = 0;
LAB_00140648:
    if ((pIVar52->NavWindow != (ImGuiWindow *)0x0) && ((pIVar52->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar52->NavDisableHighlight = true;
    }
    if (IVar31 != IVar43 && IVar43 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x27a8,"void ImGui::NavUpdate()");
    }
  }
  else if (pIVar52->NavWindow != (ImGuiWindow *)0x0) {
    IVar43 = 0;
    if ((pIVar52->NavWindow->Flags & 0x40000) != 0) goto LAB_00140648;
    fVar58 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar58) {
      bVar26 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar26 = false;
    }
    if ((GImGui->IO).NavInputs[2] <= 0.0) {
      bVar27 = false;
    }
    else {
      bVar27 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
    }
    IVar10 = pIVar52->ActiveId;
    if (bVar26 && IVar10 == 0) {
      pIVar52->NavActivateId = IVar38;
      pIVar52->NavActivateFlags = 2;
      IVar43 = IVar38;
LAB_001422d7:
      if (bVar27) {
        pIVar52->NavActivateInputId = IVar38;
        pIVar52->NavActivateFlags = 1;
      }
      IVar31 = 0;
      if (0.0 < fVar58) {
        pIVar52->NavActivateDownId = IVar38;
        IVar31 = IVar38;
      }
    }
    else {
      if (IVar10 == 0) {
        IVar43 = 0;
        goto LAB_001422d7;
      }
      if ((bool)(bVar27 & IVar10 == IVar38)) {
        pIVar52->NavActivateInputId = IVar38;
        pIVar52->NavActivateFlags = 1;
      }
      IVar43 = 0;
      IVar31 = 0;
      if (IVar10 == IVar38 && 0.0 < fVar58) {
        pIVar52->NavActivateDownId = IVar38;
        IVar31 = IVar38;
      }
      bVar26 = (bool)(bVar26 & IVar10 == IVar38);
    }
    if (bVar26) {
      pIVar52->NavActivatePressedId = IVar38;
    }
    goto LAB_00140648;
  }
  IVar38 = pIVar52->NavNextActivateId;
  if (IVar38 != 0) {
    if ((pIVar52->NavNextActivateFlags & 1U) == 0) {
      pIVar52->NavActivatePressedId = IVar38;
      pIVar52->NavActivateDownId = IVar38;
      pIVar52->NavActivateId = IVar38;
    }
    else {
      pIVar52->NavActivateInputId = IVar38;
    }
    pIVar52->NavActivateFlags = pIVar52->NavNextActivateFlags;
  }
  pIVar52->NavNextActivateId = 0;
  pIVar47 = GImGui;
  pIVar34 = GImGui->NavWindow;
  if ((pIVar34 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    if ((GImGui->NavMoveDir == -1) || (GImGui->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x280b,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    local_88 = 0.0;
    if ((GImGui->NavMoveFlags & 0x80) == 0) {
      __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x280c,"void ImGui::NavUpdateCreateMoveRequest()");
    }
LAB_00140d73:
    iVar41 = pIVar47->NavMoveDir;
    pIVar47->NavMoveForwardToNextFrame = false;
    if (iVar41 != -1) {
      move_flags = pIVar47->NavMoveFlags;
      goto LAB_00140d92;
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar47->NavMoveFlags = 0;
    pIVar47->NavMoveScrollFlags = 0;
    if (pIVar34 == (ImGuiWindow *)0x0) {
      pIVar47->NavMoveClipDir = -1;
      (pIVar47->NavScoringNoClipRect).Min.x = 3.4028235e+38;
      (pIVar47->NavScoringNoClipRect).Min.y = 3.4028235e+38;
      (pIVar47->NavScoringNoClipRect).Max.x = -3.4028235e+38;
      (pIVar47->NavScoringNoClipRect).Max.y = -3.4028235e+38;
LAB_001408bf:
      local_88 = 0.0;
      goto LAB_00140d73;
    }
    pIVar40 = pIVar47->NavWindowingTarget;
    iVar41 = -1;
    if ((pIVar40 == (ImGuiWindow *)0x0) && ((pIVar34->Flags & 0x40000) == 0)) {
      uVar30 = pIVar47->ActiveIdUsingNavDirMask;
      iVar41 = -1;
      if (((uVar30 & 1) == 0) &&
         ((fVar58 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar58 ||
          (fVar58 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat), 0.0 < fVar58)))) {
        pIVar47->NavMoveDir = 0;
        iVar41 = 0;
      }
      if (((uVar30 & 2) == 0) &&
         ((fVar58 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar58 ||
          (fVar58 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar58)))) {
        pIVar47->NavMoveDir = 1;
        iVar41 = 1;
      }
      if (((uVar30 & 4) == 0) &&
         ((fVar58 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar58 ||
          (fVar58 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar58)))) {
        pIVar47->NavMoveDir = 2;
        iVar41 = 2;
      }
      if (((uVar30 & 8) == 0) &&
         ((fVar58 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar58 ||
          (fVar58 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar58)))) {
        pIVar47->NavMoveDir = 3;
        iVar41 = 3;
      }
    }
    pIVar47->NavMoveClipDir = iVar41;
    (pIVar47->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar47->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar47->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar47->NavScoringNoClipRect).Max.y = -3.4028235e+38;
    local_88 = 0.0;
    if ((((iVar41 != -1) || (((pIVar47->IO).ConfigFlags & 1U) == 0)) ||
        (pIVar40 != (ImGuiWindow *)0x0)) || ((pIVar34->Flags & 0x40000U) != 0)) goto LAB_00140d73;
    bVar26 = false;
    bVar27 = false;
    if ((pIVar47->IO).KeysData[0x205].Down == true) {
      bVar27 = ((pIVar47->ActiveIdUsingKeyInputMask).Storage[0] & 0x20) == 0;
    }
    if ((pIVar47->IO).KeysData[0x206].Down == true) {
      bVar26 = ((pIVar47->ActiveIdUsingKeyInputMask).Storage[0] & 0x40) == 0;
    }
    bVar28 = IsKeyPressed(0x207,true);
    if (bVar28) {
      bVar28 = ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x80) == 0;
    }
    else {
      bVar28 = false;
    }
    bVar53 = IsKeyPressed(0x208,true);
    if (bVar53) {
      bVar53 = ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x100) == 0;
    }
    else {
      bVar53 = false;
    }
    local_88 = 0.0;
    if ((bVar27 == bVar26) && (bVar28 == bVar53)) goto LAB_00140d73;
    if (pIVar47->NavLayer != ImGuiNavLayer_Main) {
      NavRestoreLayer(ImGuiNavLayer_Main);
    }
    if (((pIVar34->DC).NavLayersActiveMask == 0) && ((pIVar34->DC).NavHasScroll == true)) {
      bVar26 = IsKeyPressed(0x205,true);
      if (bVar26) {
        fVar58 = (pIVar34->Scroll).y - ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y);
      }
      else {
        bVar26 = IsKeyPressed(0x206,true);
        if (!bVar26) {
          local_88 = 0.0;
          if (bVar28 == false) {
            if (bVar53 == false) goto LAB_00140d73;
            (pIVar34->ScrollTarget).y = (pIVar34->ScrollMax).y;
          }
          else {
            (pIVar34->ScrollTarget).y = 0.0;
          }
          (pIVar34->ScrollTargetCenterRatio).y = 0.0;
          (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
          goto LAB_00140d73;
        }
        fVar58 = ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) + (pIVar34->Scroll).y;
      }
      (pIVar34->ScrollTarget).y = fVar58;
      (pIVar34->ScrollTargetCenterRatio).y = 0.0;
      (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
      goto LAB_001408bf;
    }
    IVar9 = pIVar47->NavLayer;
    pIVar46 = pIVar34->NavRectRel + IVar9;
    fVar58 = GImGui->FontBaseSize * pIVar34->FontWindowScale;
    if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
      fVar58 = fVar58 * pIVar34->ParentWindow->FontWindowScale;
    }
    local_88 = (pIVar34->NavRectRel[IVar9].Max.y - pIVar34->NavRectRel[IVar9].Min.y) +
               (((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) - fVar58);
    local_88 = (float)(~-(uint)(local_88 <= 0.0) & (uint)local_88);
    bVar26 = IsKeyPressed(0x205,true);
    if (bVar26) {
      local_88 = -local_88;
      IVar33 = 2;
      iVar41 = 3;
LAB_00140d0f:
      pIVar47->NavMoveDir = iVar41;
      pIVar47->NavMoveClipDir = IVar33;
      pIVar47->NavMoveFlags = 0x30;
      if ((local_88 != 0.0) || (NAN(local_88))) {
        IVar61 = (pIVar34->InnerRect).Max;
        (pIVar47->NavScoringNoClipRect).Min = (pIVar34->InnerRect).Min;
        (pIVar47->NavScoringNoClipRect).Max = IVar61;
        (pIVar47->NavScoringNoClipRect).Min.y = (pIVar47->NavScoringNoClipRect).Min.y + local_88;
        (pIVar47->NavScoringNoClipRect).Max.y = (pIVar47->NavScoringNoClipRect).Max.y + local_88;
        goto LAB_00140d73;
      }
      move_flags = 0x30;
    }
    else {
      bVar26 = IsKeyPressed(0x206,true);
      if (bVar26) {
        IVar33 = 3;
        iVar41 = 2;
        goto LAB_00140d0f;
      }
      if (bVar28 == false) {
        local_88 = 0.0;
        if (bVar53 == false) goto LAB_00140d73;
        fVar58 = (pIVar34->ContentSize).y;
        pIVar34->NavRectRel[IVar9].Max.y = fVar58;
        pIVar34->NavRectRel[IVar9].Min.y = fVar58;
        fVar58 = (pIVar46->Min).x;
        iVar41 = 2;
      }
      else {
        pIVar34->NavRectRel[IVar9].Max.y = 0.0;
        pIVar34->NavRectRel[IVar9].Min.y = 0.0;
        fVar58 = (pIVar46->Min).x;
        iVar41 = 3;
      }
      pIVar3 = &pIVar34->NavRectRel[IVar9].Max;
      if (pIVar3->x <= fVar58 && fVar58 != pIVar3->x) {
        pIVar34->NavRectRel[IVar9].Max.x = 0.0;
        (pIVar46->Min).x = 0.0;
      }
      pIVar47->NavMoveDir = iVar41;
      pIVar47->NavMoveFlags = 0x50;
      local_88 = 0.0;
      move_flags = 0x50;
    }
    pIVar47->NavMoveForwardToNextFrame = false;
LAB_00140d92:
    NavMoveRequestSubmit(iVar41,pIVar47->NavMoveClipDir,move_flags,pIVar47->NavMoveScrollFlags);
  }
  if (pIVar47->NavMoveSubmitted == true) {
    if (pIVar47->NavId == 0) {
      pIVar47->NavInitRequest = true;
      pIVar47->NavInitRequestFromMove = true;
      pIVar47->NavInitResultId = 0;
      pIVar47->NavDisableHighlight = false;
    }
    if ((pIVar47->NavInputSource != ImGuiInputSource_Gamepad) ||
       (pIVar47->NavLayer != ImGuiNavLayer_Main || pIVar34 == (ImGuiWindow *)0x0))
    goto LAB_00140f2f;
    iVar81 = -(uint)((pIVar47->NavMoveFlags & 5U) == 0);
    register0x00001284 = -(uint)((pIVar47->NavMoveFlags & 10U) == 0);
    auVar74._8_4_ = 0xffffffff;
    auVar74._12_4_ = 0xffffffff;
    auVar69._4_4_ = register0x00001284;
    auVar69._0_4_ = register0x00001284;
    auVar69._8_4_ = register0x00001284;
    auVar69._12_4_ = register0x00001284;
    if (((auVar69 | auVar74) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      IVar61 = (pIVar34->DC).CursorStartPos;
      fVar58 = IVar61.x;
      auVar66._0_4_ = ((pIVar34->InnerRect).Min.x + -1.0) - fVar58;
      fVar80 = IVar61.y;
      auVar66._4_4_ = ((pIVar34->InnerRect).Min.y + -1.0) - fVar80;
      auVar66._8_4_ = ((pIVar34->InnerRect).Max.x + 1.0) - fVar58;
      auVar66._12_4_ = ((pIVar34->InnerRect).Max.y + 1.0) - fVar80;
      if ((((pIVar34->NavRectRel[0].Min.x < auVar66._0_4_) ||
           (pIVar34->NavRectRel[0].Min.y < auVar66._4_4_)) ||
          (auVar66._8_4_ < pIVar34->NavRectRel[0].Max.x)) ||
         (auVar66._12_4_ < pIVar34->NavRectRel[0].Max.y)) {
        auVar75._0_8_ = CONCAT44(register0x00001284,iVar81);
        auVar75._8_4_ = iVar81;
        auVar75._12_4_ = register0x00001284;
        auVar68._0_4_ = auVar66._8_4_ - auVar66._0_4_;
        auVar68._4_4_ = auVar66._12_4_ - auVar66._4_4_;
        fVar58 = GImGui->FontBaseSize * pIVar34->FontWindowScale;
        if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
          fVar58 = fVar58 * pIVar34->ParentWindow->FontWindowScale;
        }
        auVar78._0_4_ = fVar58 * 0.5;
        auVar78._4_4_ = auVar78._0_4_;
        auVar78._8_4_ = auVar78._0_4_;
        auVar78._12_4_ = auVar78._0_4_;
        auVar68._8_4_ = auVar68._0_4_;
        auVar68._12_4_ = auVar68._4_4_;
        auVar69 = minps(auVar68,auVar78);
        auVar21._4_8_ = auVar66._8_8_;
        auVar21._0_4_ = auVar66._4_4_ - auVar69._4_4_;
        auVar67._0_8_ = auVar21._0_8_ << 0x20;
        auVar67._8_4_ = auVar66._8_4_ - auVar69._8_4_;
        auVar67._12_4_ = auVar66._12_4_ - auVar69._12_4_;
        local_48.Min = (ImVec2)(~auVar75._0_8_ & 0xff7fffffff7fffff |
                               CONCAT44(auVar66._4_4_ + auVar69._4_4_,auVar66._0_4_ + auVar69._0_4_)
                               & auVar75._0_8_);
        local_48.Max = (ImVec2)(~auVar75._8_8_ & 0x7f7fffff7f7fffff | auVar67._8_8_ & auVar75._8_8_)
        ;
        ImRect::ClipWithFull(pIVar34->NavRectRel,&local_48);
        pIVar47->NavId = 0;
        pIVar47->NavFocusScopeId = 0;
      }
    }
LAB_00140f38:
    IVar9 = pIVar47->NavLayer;
    fVar58 = pIVar34->NavRectRel[IVar9].Min.x;
    fVar80 = pIVar34->NavRectRel[IVar9].Max.x;
    if (fVar80 < fVar58) {
LAB_00140f71:
      fVar70 = 0.0;
      fVar80 = 0.0;
      fVar77 = 0.0;
      fVar58 = 0.0;
    }
    else {
      fVar77 = pIVar34->NavRectRel[IVar9].Min.y;
      fVar70 = pIVar34->NavRectRel[IVar9].Max.y;
      if (fVar70 < fVar77) goto LAB_00140f71;
    }
    fVar71 = (pIVar34->DC).CursorStartPos.y;
    fVar77 = fVar77 + fVar71 + local_88;
    local_88 = fVar70 + fVar71 + local_88;
    if (local_88 < fVar77) {
      __assert_fail("!scoring_rect.IsInverted()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2865,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    fVar70 = (pIVar34->DC).CursorStartPos.x;
    fVar80 = fVar80 + fVar70;
    fVar58 = fVar58 + fVar70 + 1.0;
    if (fVar80 <= fVar58) {
      fVar58 = fVar80;
    }
    IVar73.y = fVar77;
    IVar73.x = fVar58;
    IVar60.y = local_88;
    IVar60.x = fVar58;
  }
  else {
LAB_00140f2f:
    if (pIVar34 != (ImGuiWindow *)0x0) goto LAB_00140f38;
    IVar60.x = 0.0;
    IVar60.y = 0.0;
    IVar73.x = 0.0;
    IVar73.y = 0.0;
  }
  (pIVar47->NavScoringRect).Min = IVar73;
  (pIVar47->NavScoringRect).Max = IVar60;
  if (IVar73.x < (pIVar47->NavScoringNoClipRect).Min.x) {
    (pIVar47->NavScoringNoClipRect).Min.x = IVar73.x;
  }
  if (IVar73.y < (pIVar47->NavScoringNoClipRect).Min.y) {
    (pIVar47->NavScoringNoClipRect).Min.y = IVar73.y;
  }
  pIVar3 = &(pIVar47->NavScoringNoClipRect).Max;
  fVar58 = IVar60.x;
  if (pIVar3->x <= fVar58 && fVar58 != pIVar3->x) {
    (pIVar47->NavScoringNoClipRect).Max.x = fVar58;
  }
  fVar58 = IVar60.y;
  pfVar1 = &(pIVar47->NavScoringNoClipRect).Max.y;
  if (*pfVar1 <= fVar58 && fVar58 != *pfVar1) {
    (pIVar47->NavScoringNoClipRect).Max.y = fVar58;
  }
  pIVar47 = GImGui;
  if (pIVar52->NavMoveDir == -1) {
    if (GImGui->NavMoveDir != -1) {
      __assert_fail("g.NavMoveDir == ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x2871,"void ImGui::NavUpdateCreateTabbingRequest()");
    }
    pIVar34 = GImGui->NavWindow;
    if (((((pIVar34 != (ImGuiWindow *)0x0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
         (((pIVar34->Flags & 0x40000) == 0 &&
          ((bVar26 = IsKeyPressed(0x200,true), bVar26 &&
           (((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 1) == 0)))))) &&
        ((pIVar47->IO).KeyCtrl == false)) && ((pIVar47->IO).KeyAlt == false)) {
      if ((pIVar47->IO).KeyShift == false) {
        uVar30 = (uint)(pIVar47->ActiveId != 0);
        IVar33 = 3;
      }
      else {
        IVar33 = 2;
        uVar30 = 0xffffffff;
      }
      scroll_flags = 3;
      if (pIVar34->Appearing != false) {
        scroll_flags = 0x21;
      }
      pIVar47->NavTabbingDir = uVar30;
      NavMoveRequestSubmit(-1,IVar33,0x400,scroll_flags);
      (pIVar47->NavTabbingResultFirst).InFlags = 0;
      (pIVar47->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
      (pIVar47->NavTabbingResultFirst).ID = 0;
      (pIVar47->NavTabbingResultFirst).FocusScopeId = 0;
      (pIVar47->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
      (pIVar47->NavTabbingResultFirst).DistBox = 3.4028235e+38;
      (pIVar47->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
      pIVar47->NavTabbingCounter = -1;
    }
  }
  pIVar47 = GImGui;
  if (GImGui->NavMoveScoringItems == false) {
    pbVar42 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar42;
    if (*pbVar42 != false) goto LAB_0014107f;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0014107f:
    if (pIVar47->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x26bb,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar52->NavIdIsAlive = false;
  pIVar34 = pIVar52->NavWindow;
  if (((pIVar34 != (ImGuiWindow *)0x0) && ((pIVar34->Flags & 0x40000) == 0)) &&
     (pIVar52->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar58 = pIVar47->FontBaseSize * pIVar34->FontWindowScale;
    if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
      fVar58 = fVar58 * pIVar34->ParentWindow->FontWindowScale;
    }
    fVar58 = (float)(int)(fVar58 * 100.0 * (pIVar52->IO).DeltaTime + 0.5);
    if (((pIVar34->DC).NavLayersActiveMask == 0) &&
       (uVar30 = pIVar52->NavMoveDir, (uVar30 != 0xffffffff & (pIVar34->DC).NavHasScroll) == 1)) {
      if (uVar30 < 2) {
        (pIVar34->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0019b8e8 + (ulong)(uVar30 == 0) * 4) * fVar58 +
                         (pIVar34->Scroll).x);
        (pIVar34->ScrollTargetCenterRatio).x = 0.0;
        (pIVar34->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar30 & 0xfffffffe) == 2) {
        (pIVar34->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0019b8e8 + (ulong)(uVar30 == 2) * 4) * fVar58 +
                         (pIVar34->Scroll).y);
        (pIVar34->ScrollTargetCenterRatio).y = 0.0;
        (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar61 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    fVar80 = IVar61.x;
    fVar77 = IVar61.y;
    if (((fVar80 != 0.0) || (NAN(fVar80))) && (pIVar34->ScrollbarX == true)) {
      (pIVar34->ScrollTarget).x = (float)(int)(fVar80 * fVar58 + (pIVar34->Scroll).x);
      (pIVar34->ScrollTargetCenterRatio).x = 0.0;
      (pIVar34->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar77 != 0.0) || (NAN(fVar77))) {
      (pIVar34->ScrollTarget).y = (float)(int)(fVar77 * fVar58 + (pIVar34->Scroll).y);
      (pIVar34->ScrollTargetCenterRatio).y = 0.0;
      (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar48 & 1) == 0 && cVar8 == '\0') {
    pIVar52->NavDisableHighlight = true;
    pIVar52->NavDisableMouseHover = false;
  }
  else if (((bVar55) && (((pIVar52->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar52->IO).BackendFlags & 4) != 0)) {
    IVar61 = NavCalcPreferredRefPos();
    (pIVar52->IO).MousePosPrev = IVar61;
    (pIVar52->IO).MousePos = IVar61;
    (pIVar52->IO).WantSetMousePos = true;
    pIVar47 = GImGui;
  }
  pIVar52->NavScoringDebugCount = 0;
  pIVar3 = &(pIVar47->IO).MousePos;
  bVar55 = IsMousePosValid(pIVar3);
  if (bVar55) {
    IVar61 = (pIVar47->IO).MousePos;
    fVar58 = IVar61.x;
    fVar80 = IVar61.y;
    IVar62.x = (float)(int)((int)fVar58 - (uint)((float)(int)fVar58 != fVar58 && fVar58 < 0.0));
    IVar62.y = (float)(int)((int)fVar80 - (uint)((float)(int)fVar80 != fVar80 && fVar80 < 0.0));
    pIVar47->MouseLastValidPos = IVar62;
    (pIVar47->IO).MousePos = IVar62;
  }
  bVar55 = IsMousePosValid(pIVar3);
  if ((bVar55) && (bVar55 = IsMousePosValid(&(pIVar47->IO).MousePosPrev), bVar55)) {
    IVar61 = (pIVar47->IO).MousePos;
    IVar59 = (pIVar47->IO).MousePosPrev;
    IVar63.x = IVar61.x - IVar59.x;
    IVar63.y = IVar61.y - IVar59.y;
    (pIVar47->IO).MouseDelta = IVar63;
    if (((IVar63.x != 0.0) || (NAN(IVar63.x))) || ((IVar63.y != 0.0 || (NAN(IVar63.y))))) {
      pIVar47->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar47->IO).MouseDelta.x = 0.0;
    (pIVar47->IO).MouseDelta.y = 0.0;
  }
  (pIVar47->IO).MousePosPrev = (pIVar47->IO).MousePos;
  lVar50 = 0;
  do {
    if ((pIVar47->IO).MouseDown[lVar50] == true) {
      fVar58 = (pIVar47->IO).MouseDownDuration[lVar50];
      pbVar42 = (pIVar47->IO).MouseClicked + lVar50;
      *pbVar42 = fVar58 < 0.0;
      (pIVar47->IO).MouseClickedCount[lVar50] = 0;
      pbVar42[0x1e] = false;
      (pIVar47->IO).MouseDownDurationPrev[lVar50] = fVar58;
      if (0.0 <= fVar58) {
        (pIVar47->IO).MouseDownDuration[lVar50] = fVar58 + (pIVar47->IO).DeltaTime;
        bVar55 = IsMousePosValid(pIVar3);
        fVar58 = 0.0;
        if (bVar55) {
          fVar58 = (pIVar47->IO).MousePos.x - (pIVar47->IO).MouseClickedPos[lVar50].x;
          fVar80 = (pIVar47->IO).MousePos.y - (pIVar47->IO).MouseClickedPos[lVar50].y;
          fVar58 = fVar58 * fVar58 + fVar80 * fVar80;
        }
        fVar80 = (pIVar47->IO).MouseDragMaxDistanceSqr[lVar50];
        uVar30 = -(uint)(fVar58 <= fVar80);
        (pIVar47->IO).MouseDragMaxDistanceSqr[lVar50] =
             (float)(~uVar30 & (uint)fVar58 | (uint)fVar80 & uVar30);
        IVar29 = (pIVar47->IO).MouseClickedCount[lVar50];
      }
      else {
        (pIVar47->IO).MouseDownDuration[lVar50] = 0.0;
        if ((pIVar47->IO).MouseDoubleClickTime <=
            (float)(pIVar47->Time - (pIVar47->IO).MouseClickedTime[lVar50])) {
LAB_00141506:
          (pIVar47->IO).MouseClickedLastCount[lVar50] = 1;
        }
        else {
          bVar55 = IsMousePosValid(pIVar3);
          fVar58 = 0.0;
          fVar80 = 0.0;
          if (bVar55) {
            IVar61 = (pIVar47->IO).MousePos;
            IVar59 = (pIVar47->IO).MouseClickedPos[lVar50];
            fVar58 = IVar61.x - IVar59.x;
            fVar80 = IVar61.y - IVar59.y;
          }
          fVar77 = (pIVar47->IO).MouseDoubleClickMaxDist;
          if (fVar77 * fVar77 <= fVar58 * fVar58 + fVar80 * fVar80) goto LAB_00141506;
          pIVar7 = (pIVar47->IO).MouseClickedLastCount + lVar50;
          *pIVar7 = *pIVar7 + 1;
        }
        (pIVar47->IO).MouseClickedTime[lVar50] = pIVar47->Time;
        (pIVar47->IO).MouseClickedPos[lVar50] = (pIVar47->IO).MousePos;
        IVar29 = (pIVar47->IO).MouseClickedLastCount[lVar50];
        (pIVar47->IO).MouseClickedCount[lVar50] = IVar29;
        (pIVar47->IO).MouseDragMaxDistanceSqr[lVar50] = 0.0;
      }
    }
    else {
      (pIVar47->IO).MouseClicked[lVar50] = false;
      (pIVar47->IO).MouseClickedCount[lVar50] = 0;
      fVar58 = (pIVar47->IO).MouseDownDuration[lVar50];
      (pIVar47->IO).MouseReleased[lVar50] = 0.0 <= fVar58;
      pbVar42 = (pIVar47->IO).MouseClicked + lVar50;
      (pIVar47->IO).MouseDownDurationPrev[lVar50] = fVar58;
      (pIVar47->IO).MouseDownDuration[lVar50] = -1.0;
      IVar29 = 0;
    }
    (pIVar47->IO).MouseDoubleClicked[lVar50] = IVar29 == 2;
    if (*pbVar42 == true) {
      pIVar47->NavDisableMouseHover = false;
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar34 = GetTopMostPopupModal();
  if ((pIVar34 != (ImGuiWindow *)0x0) ||
     ((pIVar23->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar23->NavWindowingHighlightAlpha)))) {
    fVar58 = (pIVar23->IO).DeltaTime * 6.0 + pIVar23->DimBgRatio;
    if (1.0 <= fVar58) {
      fVar58 = 1.0;
    }
    pIVar23->DimBgRatio = fVar58;
  }
  else {
    fVar58 = (pIVar23->IO).DeltaTime * -10.0 + pIVar23->DimBgRatio;
    pIVar23->DimBgRatio = (float)(-(uint)(0.0 <= fVar58) & (uint)fVar58);
  }
  pIVar23->MouseCursor = 0;
  pIVar23->WantTextInputNextFrame = -1;
  pIVar23->WantCaptureMouseNextFrame = -1;
  pIVar23->WantCaptureKeyboardNextFrame = -1;
  uVar25 = *(undefined3 *)&(pIVar23->PlatformImeData).field_0x1;
  fVar58 = (pIVar23->PlatformImeData).InputPos.x;
  uVar22 = *(undefined8 *)&(pIVar23->PlatformImeData).InputPos.y;
  (pIVar23->PlatformImeDataPrev).WantVisible = (pIVar23->PlatformImeData).WantVisible;
  *(undefined3 *)&(pIVar23->PlatformImeDataPrev).field_0x1 = uVar25;
  (pIVar23->PlatformImeDataPrev).InputPos.x = fVar58;
  *(undefined8 *)&(pIVar23->PlatformImeDataPrev).InputPos.y = uVar22;
  (pIVar23->PlatformImeData).WantVisible = false;
  pIVar52 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar55 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar55) &&
        (fVar80 = (pIVar52->IO).MousePos.x - (pIVar52->WheelingWindowRefMousePos).x,
        fVar77 = (pIVar52->IO).MousePos.y - (pIVar52->WheelingWindowRefMousePos).y,
        fVar58 = (pIVar52->IO).MouseDragThreshold,
        fVar58 * fVar58 < fVar80 * fVar80 + fVar77 * fVar77)) ||
       (pIVar52->WheelingWindowTimer <= 0.0)) {
      pIVar52->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar52->WheelingWindowTimer = 0.0;
    }
  }
  pIVar47 = GImGui;
  fVar58 = (pIVar52->IO).MouseWheel;
  if ((((fVar58 != 0.0) || (fVar80 = (pIVar52->IO).MouseWheelH, fVar80 != 0.0)) || (NAN(fVar80))) &&
     ((((pIVar52->ActiveId == 0 || (pIVar52->ActiveIdUsingMouseWheel == false)) &&
       ((pIVar52->HoveredIdPreviousFrame == 0 ||
        (pIVar52->HoveredIdPreviousFrameUsingMouseWheel == false)))) &&
      (((pIVar34 = pIVar52->WheelingWindow, pIVar34 != (ImGuiWindow *)0x0 ||
        (pIVar34 = pIVar52->HoveredWindow, pIVar34 != (ImGuiWindow *)0x0)) &&
       (pIVar34->Collapsed == false)))))) {
    bVar55 = (pIVar52->IO).KeyCtrl;
    if ((fVar58 != 0.0) || (NAN(fVar58))) {
      if ((bVar55 & 1U) == 0) goto LAB_001420b4;
      if ((pIVar52->IO).FontAllowUserScaling == true) {
        if (GImGui->WheelingWindow != pIVar34) {
          GImGui->WheelingWindow = pIVar34;
          pIVar47->WheelingWindowRefMousePos = (pIVar47->IO).MousePos;
          pIVar47->WheelingWindowTimer = 2.0;
          fVar58 = (pIVar52->IO).MouseWheel;
        }
        fVar80 = pIVar34->FontWindowScale;
        fVar77 = fVar58 * 0.1 + fVar80;
        fVar58 = 2.5;
        if (fVar77 <= 2.5) {
          fVar58 = fVar77;
        }
        fVar58 = (float)(-(uint)(fVar77 < 0.5) & 0x3f000000 | ~-(uint)(fVar77 < 0.5) & (uint)fVar58)
        ;
        pIVar34->FontWindowScale = fVar58;
        if (pIVar34 == pIVar34->RootWindow) {
          fVar58 = fVar58 / fVar80;
          IVar61 = pIVar34->Size;
          auVar76._8_8_ = 0;
          auVar76._0_4_ = IVar61.x;
          auVar76._4_4_ = IVar61.y;
          IVar59 = (pIVar52->IO).MousePos;
          fVar80 = (pIVar34->Pos).x;
          fVar77 = (pIVar34->Pos).y;
          auVar79._0_4_ = (IVar59.x - fVar80) * (1.0 - fVar58) * IVar61.x;
          auVar79._4_4_ = (IVar59.y - fVar77) * (1.0 - fVar58) * IVar61.y;
          auVar79._8_8_ = 0;
          auVar69 = divps(auVar79,auVar76);
          local_48.Min.x = auVar69._0_4_ + fVar80;
          local_48.Min.y = auVar69._4_4_ + fVar77;
          SetWindowPos(pIVar34,&local_48.Min,0);
          IVar61 = pIVar34->SizeFull;
          IVar64.x = (float)(int)((pIVar34->Size).x * fVar58);
          IVar64.y = (float)(int)((pIVar34->Size).y * fVar58);
          pIVar34->Size = IVar64;
          (pIVar34->SizeFull).x = (float)(int)(IVar61.x * fVar58);
          (pIVar34->SizeFull).y = (float)(int)(IVar61.y * fVar58);
        }
      }
    }
    else if ((bVar55 & 1U) == 0) {
LAB_001420b4:
      if (((pIVar52->IO).KeyShift != true) ||
         (fVar80 = fVar58, (pIVar52->IO).ConfigMacOSXBehaviors == true)) {
        fVar80 = (pIVar52->IO).MouseWheelH;
        if ((fVar58 != 0.0) || (NAN(fVar58))) {
          if (GImGui->WheelingWindow != pIVar34) {
            GImGui->WheelingWindow = pIVar34;
            pIVar47->WheelingWindowRefMousePos = (pIVar47->IO).MousePos;
            pIVar47->WheelingWindowTimer = 2.0;
          }
          uVar30 = pIVar34->Flags;
          while (((uVar30 >> 0x18 & 1) != 0 &&
                 (((uVar30 & 0x210) == 0x10 ||
                  ((fVar77 = (pIVar34->ScrollMax).y, fVar77 == 0.0 && (!NAN(fVar77)))))))) {
            pIVar34 = pIVar34->ParentWindow;
            uVar30 = pIVar34->Flags;
          }
          if ((uVar30 & 0x210) == 0) {
            fVar77 = ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) * 0.67;
            fVar70 = pIVar47->FontBaseSize * pIVar34->FontWindowScale;
            if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
              fVar70 = fVar70 * pIVar34->ParentWindow->FontWindowScale;
            }
            fVar71 = fVar70 * 5.0;
            if (fVar77 <= fVar70 * 5.0) {
              fVar71 = fVar77;
            }
            (pIVar34->ScrollTarget).y = (pIVar34->Scroll).y - fVar58 * (float)(int)fVar71;
            (pIVar34->ScrollTargetCenterRatio).y = 0.0;
            (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
      }
      pIVar52 = GImGui;
      if ((fVar80 != 0.0) || (NAN(fVar80))) {
        if (GImGui->WheelingWindow != pIVar34) {
          GImGui->WheelingWindow = pIVar34;
          pIVar52->WheelingWindowRefMousePos = (pIVar52->IO).MousePos;
          pIVar52->WheelingWindowTimer = 2.0;
        }
        while ((uVar30 = pIVar34->Flags, (uVar30 >> 0x18 & 1) != 0 &&
               (((uVar30 & 0x210) == 0x10 ||
                ((fVar58 = (pIVar34->ScrollMax).x, fVar58 == 0.0 && (!NAN(fVar58)))))))) {
          pIVar34 = pIVar34->ParentWindow;
        }
        if ((uVar30 & 0x210) == 0) {
          fVar58 = ((pIVar34->InnerRect).Max.x - (pIVar34->InnerRect).Min.x) * 0.67;
          fVar77 = pIVar52->FontBaseSize * pIVar34->FontWindowScale;
          if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
            fVar77 = fVar77 * pIVar34->ParentWindow->FontWindowScale;
          }
          fVar70 = fVar77 + fVar77;
          if (fVar58 <= fVar77 + fVar77) {
            fVar70 = fVar58;
          }
          (pIVar34->ScrollTarget).x = (pIVar34->Scroll).x - fVar80 * (float)(int)fVar70;
          (pIVar34->ScrollTargetCenterRatio).x = 0.0;
          (pIVar34->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  uVar30 = (pIVar23->Windows).Size;
  if ((int)uVar30 < (pIVar23->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x111a,"void ImGui::NewFrame()");
  }
  local_78 = 3.4028235e+38;
  if ((pIVar23->GcCompactAll == false) &&
     (fVar58 = (pIVar23->IO).ConfigMemoryCompactTimer, 0.0 <= fVar58)) {
    local_78 = (float)pIVar23->Time - fVar58;
  }
  if (uVar30 != 0) {
    uVar49 = 0;
    do {
      if ((long)(int)uVar30 <= (long)uVar49) {
        pcVar39 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0014251c;
      }
      pIVar34 = (pIVar23->Windows).Data[uVar49];
      bVar55 = pIVar34->Active;
      pIVar34->WasActive = bVar55;
      pIVar34->BeginCount = 0;
      pIVar34->Active = false;
      pIVar34->WriteAccessed = false;
      if (((bVar55 == false) && (pIVar34->MemoryCompacted == false)) &&
         (pIVar34->LastTimeActive <= local_78 && local_78 != pIVar34->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar34);
        uVar30 = (pIVar23->Windows).Size;
      }
      uVar49 = uVar49 + 1;
    } while (uVar49 != uVar30);
  }
  iVar41 = (pIVar23->TablesLastTimeActive).Size;
  if (0 < iVar41) {
    lVar50 = 0;
    lVar51 = 0;
    do {
      fVar58 = (pIVar23->TablesLastTimeActive).Data[lVar51];
      if ((0.0 <= fVar58) && (fVar58 < local_78)) {
        if ((pIVar23->Tables).Buf.Size <= lVar51) {
          pcVar39 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_0014251c;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar23->Tables).Buf.Data)->ID + lVar50));
        iVar41 = (pIVar23->TablesLastTimeActive).Size;
      }
      lVar51 = lVar51 + 1;
      lVar50 = lVar50 + 0x208;
    } while (lVar51 < iVar41);
  }
  iVar41 = (pIVar23->TablesTempData).Size;
  if (0 < iVar41) {
    lVar50 = 0;
    lVar51 = 0;
    do {
      pIVar16 = (pIVar23->TablesTempData).Data;
      fVar58 = *(float *)((long)&pIVar16->LastTimeActive + lVar50);
      if ((0.0 <= fVar58) && (fVar58 < local_78)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar16->TableIndex + lVar50));
        iVar41 = (pIVar23->TablesTempData).Size;
      }
      lVar51 = lVar51 + 1;
      lVar50 = lVar50 + 0x70;
    } while (lVar51 < iVar41);
  }
  if (pIVar23->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar23->GcCompactAll = false;
  if ((pIVar23->NavWindow != (ImGuiWindow *)0x0) && (pIVar23->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar23->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar36 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar36 = *piVar36 + 1;
    }
    __dest_01 = (ImGuiWindowStackData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar17 = (pIVar23->CurrentWindowStack).Data;
    if (pIVar17 != (ImGuiWindowStackData *)0x0) {
      memcpy(__dest_01,pIVar17,(long)(pIVar23->CurrentWindowStack).Size * 0x58);
      pIVar17 = (pIVar23->CurrentWindowStack).Data;
      if ((pIVar17 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar36 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar36 = *piVar36 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar17,GImAllocatorUserData);
    }
    (pIVar23->CurrentWindowStack).Data = __dest_01;
    (pIVar23->CurrentWindowStack).Capacity = 0;
  }
  (pIVar23->CurrentWindowStack).Size = 0;
  if ((pIVar23->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar36 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar36 = *piVar36 + 1;
    }
    __dest_02 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar18 = (pIVar23->BeginPopupStack).Data;
    if (pIVar18 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_02,pIVar18,(long)(pIVar23->BeginPopupStack).Size * 0x30);
      pIVar18 = (pIVar23->BeginPopupStack).Data;
      if ((pIVar18 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar36 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar36 = *piVar36 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
    }
    (pIVar23->BeginPopupStack).Data = __dest_02;
    (pIVar23->BeginPopupStack).Capacity = 0;
  }
  (pIVar23->BeginPopupStack).Size = 0;
  iVar41 = (pIVar23->ItemFlagsStack).Capacity;
  if (iVar41 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar36 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar36 = *piVar36 + 1;
    }
    piVar35 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar36 = (pIVar23->ItemFlagsStack).Data;
    if (piVar36 != (int *)0x0) {
      memcpy(piVar35,piVar36,(long)(pIVar23->ItemFlagsStack).Size << 2);
      piVar36 = (pIVar23->ItemFlagsStack).Data;
      if ((piVar36 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar36,GImAllocatorUserData);
    }
    (pIVar23->ItemFlagsStack).Data = piVar35;
    (pIVar23->ItemFlagsStack).Size = 0;
    (pIVar23->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar23->ItemFlagsStack).Size = 0;
    if (iVar41 != 0) {
      piVar36 = (pIVar23->ItemFlagsStack).Data;
      lVar50 = 0;
      goto LAB_00141bea;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar36 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar36 = *piVar36 + 1;
  }
  piVar36 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar35 = (pIVar23->ItemFlagsStack).Data;
  if (piVar35 != (int *)0x0) {
    memcpy(piVar36,piVar35,(long)(pIVar23->ItemFlagsStack).Size << 2);
    piVar35 = (pIVar23->ItemFlagsStack).Data;
    if ((piVar35 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar35,GImAllocatorUserData);
  }
  (pIVar23->ItemFlagsStack).Data = piVar36;
  (pIVar23->ItemFlagsStack).Capacity = 8;
  lVar50 = (long)(pIVar23->ItemFlagsStack).Size;
LAB_00141bea:
  piVar36[lVar50] = 0;
  (pIVar23->ItemFlagsStack).Size = (pIVar23->ItemFlagsStack).Size + 1;
  if ((pIVar23->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar36 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar36 = *piVar36 + 1;
    }
    __dest_03 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar19 = (pIVar23->GroupStack).Data;
    if (pIVar19 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_03,pIVar19,(long)(pIVar23->GroupStack).Size * 0x30);
      pIVar19 = (pIVar23->GroupStack).Data;
      if ((pIVar19 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar36 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar36 = *piVar36 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar19,GImAllocatorUserData);
    }
    (pIVar23->GroupStack).Data = __dest_03;
    (pIVar23->GroupStack).Capacity = 0;
  }
  (pIVar23->GroupStack).Size = 0;
  pIVar52 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar52->DebugItemPickerActive == true) {
    uVar30 = pIVar52->HoveredIdPreviousFrame;
    pIVar52->MouseCursor = 7;
    bVar55 = IsKeyPressed(0x20e,true);
    if (bVar55) {
      pIVar52->DebugItemPickerActive = false;
    }
    pIVar47 = GImGui;
    fVar58 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar58 != 0.0) || (NAN(fVar58))) {
      uVar48 = (uint)(uVar30 == 0);
    }
    else if (uVar30 == 0) {
      uVar48 = 1;
    }
    else {
      pIVar52->DebugItemPickerBreakId = uVar30;
      pIVar52->DebugItemPickerActive = false;
      uVar48 = 0;
    }
    pIVar5 = &pIVar47->NextWindowData;
    *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
    (pIVar47->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar30);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar48 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar52 = GImGui;
  }
  pIVar52->DebugHookIdInfo = 0;
  if (pIVar52->FrameCount == (pIVar52->DebugStackTool).LastActiveFrame + 1) {
    IVar38 = pIVar52->HoveredIdPreviousFrame;
    if (IVar38 == 0) {
      IVar38 = pIVar52->ActiveId;
    }
    if ((pIVar52->DebugStackTool).QueryId != IVar38) {
      (pIVar52->DebugStackTool).QueryId = IVar38;
      (pIVar52->DebugStackTool).StackLevel = -1;
      if ((pIVar52->DebugStackTool).Results.Capacity < 0) {
        piVar36 = &(pIVar52->IO).MetricsActiveAllocations;
        *piVar36 = *piVar36 + 1;
        __dest_04 = (ImGuiStackLevelInfo *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar20 = (pIVar52->DebugStackTool).Results.Data;
        if (pIVar20 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest_04,pIVar20,(long)(pIVar52->DebugStackTool).Results.Size << 6);
          pIVar20 = (pIVar52->DebugStackTool).Results.Data;
          if ((pIVar20 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar36 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar36 = *piVar36 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
        }
        (pIVar52->DebugStackTool).Results.Data = __dest_04;
        (pIVar52->DebugStackTool).Results.Capacity = 0;
      }
      (pIVar52->DebugStackTool).Results.Size = 0;
    }
    if (IVar38 != 0) {
      uVar30 = (pIVar52->DebugStackTool).StackLevel;
      lVar50 = (long)(int)uVar30;
      if (lVar50 < 0) {
        if (uVar30 == 0xffffffff) {
          pIVar52->DebugHookIdInfo = IVar38;
        }
      }
      else {
        iVar41 = (pIVar52->DebugStackTool).Results.Size;
        if (((int)uVar30 < iVar41) &&
           ((pIVar20 = (pIVar52->DebugStackTool).Results.Data, pIVar20[lVar50].QuerySuccess != false
            || ('\x02' < pIVar20[lVar50].QueryFrameCount)))) {
          uVar30 = uVar30 + 1;
          (pIVar52->DebugStackTool).StackLevel = uVar30;
        }
        if ((int)uVar30 < iVar41) {
          pIVar20 = (pIVar52->DebugStackTool).Results.Data;
          pIVar52->DebugHookIdInfo = pIVar20[uVar30].ID;
          pIVar6 = &pIVar20[uVar30].QueryFrameCount;
          *pIVar6 = *pIVar6 + '\x01';
        }
      }
    }
  }
  pIVar23->WithinFrameScopeWithImplicitWindow = true;
  pIVar52 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar52->NextWindowData).SizeVal.x = 400.0;
  (pIVar52->NextWindowData).SizeVal.y = 400.0;
  (pIVar52->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar23->CurrentWindow->IsFallbackWindow != false) {
    iVar41 = (pIVar23->Hooks).Size;
    if (0 < iVar41) {
      lVar50 = 0;
      lVar51 = 0;
      do {
        pIVar11 = (pIVar23->Hooks).Data;
        if (*(int *)(pIVar11 + lVar50 + 4) == 1) {
          (**(code **)(pIVar11 + lVar50 + 0x10))(pIVar23,pIVar11 + lVar50);
          iVar41 = (pIVar23->Hooks).Size;
        }
        lVar51 = lVar51 + 1;
        lVar50 = lVar50 + 0x20;
      } while (lVar51 < iVar41);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x114a,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}